

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LabelFileParser.cpp
# Opt level: O0

void __thiscall LabelFileParser::writeLabelList(LabelFileParser *this,string *labelListFilename)

{
  size_type sVar1;
  const_reference pvVar2;
  int local_228;
  int c;
  string local_218 [8];
  ofstream labelListFp;
  string *labelListFilename_local;
  LabelFileParser *this_local;
  
  std::ofstream::ofstream(local_218);
  std::ofstream::open(local_218,(_Ios_Openmode)labelListFilename);
  local_228 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->_labelList);
    if (sVar1 <= (ulong)(long)local_228) break;
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->_labelList,(long)local_228);
    std::operator<<((ostream *)local_218,(string *)pvVar2);
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->_labelList);
    if ((long)local_228 != sVar1 - 1) {
      std::ostream::operator<<((ostream *)local_218,std::endl<char,std::char_traits<char>>);
    }
    local_228 = local_228 + 1;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void LabelFileParser::writeLabelList(string labelListFilename)const{//{{{
    ofstream labelListFp;
    labelListFp.open(labelListFilename,ios::out);
    for(int c=0; c<_labelList.size(); c++){
        labelListFp<<_labelList[c];
        if(c != (_labelList.size()-1))labelListFp<<endl;
    }
    labelListFp.close();
}